

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_encode_se(aec_stream *strm)

{
  uint32_t uVar1;
  uint32_t uVar2;
  internal_state *piVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  code *vec;
  vector_t *extraout_RAX;
  int iVar11;
  size_t sVar12;
  uint uVar13;
  int iVar14;
  
  piVar3 = strm->state;
  iVar14 = piVar3->id_len;
  iVar6 = piVar3->bits;
  if (iVar14 < iVar6) {
    iVar6 = iVar6 - (iVar14 + 1);
    piVar3->bits = iVar6;
    *piVar3->cds = *piVar3->cds + (char)(1 << ((byte)iVar6 & 0x1f));
  }
  else {
    iVar11 = (iVar14 + 1) - iVar6;
    puVar4 = piVar3->cds;
    piVar3->cds = puVar4 + 1;
    *puVar4 = *puVar4 + (char)(1L >> ((byte)iVar11 & 0x3f));
    if (8 < iVar11) {
      uVar7 = (iVar14 - iVar6) + 9;
      do {
        uVar13 = uVar7;
        puVar4 = piVar3->cds;
        piVar3->cds = puVar4 + 1;
        *puVar4 = (uint8_t)(1 >> ((char)uVar13 - 0x10U & 0x1f));
        uVar7 = uVar13 - 8;
      } while (0x10 < uVar13 - 8);
      iVar11 = uVar13 - 0x10;
    }
    piVar3->bits = 8 - iVar11;
    *piVar3->cds = (uint8_t)(1 << ((byte)(8 - iVar11) & 0x1f));
  }
  if (piVar3->ref != 0) {
    iVar14 = piVar3->bits;
    uVar13 = piVar3->ref_sample;
    uVar7 = strm->bits_per_sample;
    if (iVar14 < (int)uVar7) {
      uVar7 = uVar7 - iVar14;
      puVar4 = piVar3->cds;
      piVar3->cds = puVar4 + 1;
      *puVar4 = *puVar4 + (char)(uVar13 >> ((byte)uVar7 & 0x3f));
      uVar8 = uVar7;
      if (8 < (int)uVar7) {
        do {
          uVar7 = uVar8 - 8;
          puVar4 = piVar3->cds;
          piVar3->cds = puVar4 + 1;
          *puVar4 = (uint8_t)(uVar13 >> ((byte)uVar7 & 0x1f));
          bVar5 = 0x10 < uVar8;
          uVar8 = uVar7;
        } while (bVar5);
      }
      piVar3->bits = 8 - uVar7;
      *piVar3->cds = (uint8_t)(uVar13 << ((byte)(8 - uVar7) & 0x1f));
    }
    else {
      piVar3->bits = iVar14 - uVar7;
      *piVar3->cds = *piVar3->cds + (char)(uVar13 << ((byte)(iVar14 - uVar7) & 0x1f));
    }
  }
  if (strm->block_size != 0) {
    uVar9 = 0;
    do {
      uVar1 = piVar3->block[uVar9];
      uVar2 = piVar3->block[uVar9 + 1];
      uVar7 = ((uVar2 + uVar1 + 1) * (uVar2 + uVar1) >> 1) + uVar2;
      iVar14 = piVar3->bits;
      if (iVar14 <= (int)uVar7) {
        do {
          uVar7 = uVar7 - iVar14;
          puVar4 = piVar3->cds;
          piVar3->cds = puVar4 + 1;
          puVar4[1] = '\0';
          iVar14 = 8;
        } while (7 < (int)uVar7);
      }
      piVar3->bits = ~uVar7 + iVar14;
      *piVar3->cds = *piVar3->cds + (char)(1 << ((byte)(~uVar7 + iVar14) & 0x1f));
      uVar9 = uVar9 + 2;
    } while (uVar9 < strm->block_size);
  }
  piVar3 = strm->state;
  if (piVar3->direct_out == 0) {
    piVar3->i = 0;
    vec = m_flush_block_resumable;
    piVar3->mode = m_flush_block_resumable;
  }
  else {
    lVar10 = (long)(*(int *)&piVar3->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar10;
    sVar12 = strm->avail_out - lVar10;
    strm->avail_out = sVar12;
    vec = m_get_block;
    piVar3->mode = m_get_block;
    if (((piVar3->ready_to_capture_rsi != 0) && (piVar3->blocks_avail == 0)) &&
       (vec = (code *)piVar3->offsets, (vector_t *)vec != (vector_t *)0x0)) {
      vector_push_back((vector_t *)vec,((strm->total_out - sVar12) * 8 - (long)piVar3->bits) + 8);
      piVar3->ready_to_capture_rsi = 0;
      vec = (code *)extraout_RAX;
    }
  }
  return (int)vec;
}

Assistant:

static int m_encode_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 1, state->id_len + 1);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    for (size_t i = 0; i < strm->block_size; i+= 2) {
        uint32_t d = state->block[i] + state->block[i + 1];
        emitfs(state, d * (d + 1) / 2 + state->block[i + 1]);
    }

    return m_flush_block(strm);
}